

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> * __thiscall
QPixmapStylePrivate::getCachedPixmap
          (QPixmapStylePrivate *this,ControlDescriptor control,QPixmapStyleDescriptor *desc,
          QSize *size)

{
  int iVar1;
  QPixmapStyle *pQVar2;
  ulong uVar3;
  QPixmapStyleDescriptor *in_RCX;
  int in_EDX;
  QPixmapStylePrivate *in_RSI;
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *in_RDI;
  long in_FS_OFFSET;
  QPixmapStyle *q;
  QPixmap *result;
  QPixmap source;
  QString key;
  QString sizeString;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *this_00;
  QPixmapStyleDescriptor *desc_00;
  undefined4 in_stack_fffffffffffffe28;
  QPixmap local_1c0 [28];
  uint local_1a4;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  undefined2 local_182;
  undefined1 local_180 [80];
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 local_118 [30];
  undefined2 local_fa;
  undefined1 local_f8 [24];
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = q_func(in_RSI);
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  local_d0 = &DAT_aaaaaaaaaaaaaaaa;
  iVar1 = QSize::width((QSize *)0x402f97);
  QString::number((int)local_f8,iVar1);
  local_fa = 0x2a;
  ::operator%((QString *)in_RDI,
              (char16_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  iVar1 = QSize::height((QSize *)0x402fdc);
  QString::number((int)local_118,iVar1);
  ::operator%((QStringBuilder<QString,_char16_t> *)in_RDI,
              (QString *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffde8);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  QString::~QString((QString *)0x40303c);
  QStringBuilder<QString,_char16_t>::~QStringBuilder((QStringBuilder<QString,_char16_t> *)0x403049);
  QString::~QString((QString *)0x403056);
  local_130 = &DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  local_120 = &DAT_aaaaaaaaaaaaaaaa;
  (*(code *)**(undefined8 **)&(pQVar2->super_QCommonStyle).super_QStyle)();
  QMetaObject::className();
  QLatin1String::QLatin1String((QLatin1String *)this_00,(char *)in_RDI);
  QString::number((int)local_180,in_EDX);
  ::operator%((QLatin1String *)in_RDI,
              (QString *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  local_182 = 0x40;
  ::operator%(&in_RDI->a,(char16_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  ::operator%(in_RDI,(QString *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  ::QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>,_const_QString_&>
              *)in_stack_fffffffffffffde8);
  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>,_const_QString_&>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>,_const_QString_&>
                     *)0x40313e);
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)0x40314b);
  QStringBuilder<QLatin1String,_QString>::~QStringBuilder
            ((QStringBuilder<QLatin1String,_QString> *)0x403158);
  QString::~QString((QString *)0x403165);
  ((DataPointer *)&(this_00->a).a)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)&(this_00->a).a)->ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (this_00->a).b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)this_00);
  uVar3 = QPixmapCache::find((QString *)&local_130,(QPixmap *)this_00);
  if ((uVar3 & 1) == 0) {
    local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_198 = &DAT_aaaaaaaaaaaaaaaa;
    local_190 = &DAT_aaaaaaaaaaaaaaaa;
    desc_00 = in_RCX;
    QFlags<Qt::ImageConversionFlag>::QFlags
              ((QFlags<Qt::ImageConversionFlag> *)
               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (ImageConversionFlag)((ulong)in_RCX >> 0x20));
    QPixmap::QPixmap((QPixmap *)&local_1a0,(QString *)in_RCX,(char *)0x0,
                     (QFlags_conflict1 *)(ulong)local_1a4);
    iVar1 = QSize::width((QSize *)0x40320d);
    QSize::height((QSize *)0x40321b);
    scale((int)((ulong)in_RSI >> 0x20),(int)in_RSI,
          (QPixmap *)CONCAT44(in_EDX,in_stack_fffffffffffffe28),desc_00);
    QPixmap::operator=((QPixmap *)in_RDI,(QPixmap *)CONCAT44(iVar1,in_stack_fffffffffffffdf0));
    QPixmap::~QPixmap(local_1c0);
    QPixmapCache::insert((QString *)&local_130,(QPixmap *)this_00);
    QPixmap::~QPixmap((QPixmap *)&local_1a0);
  }
  QString::~QString((QString *)0x40328d);
  QString::~QString((QString *)0x40329a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QPixmap QPixmapStylePrivate::getCachedPixmap(QPixmapStyle::ControlDescriptor control,
                                             const QPixmapStyleDescriptor &desc,
                                             const QSize &size) const
{
    Q_Q(const QPixmapStyle);

    const QString sizeString = QString::number(size.width()) % u'*'
            % QString::number(size.height());
    const QString key = QLatin1StringView(q->metaObject()->className()) % QString::number(control)
            % u'@' % sizeString;

    QPixmap result;

    if (!QPixmapCache::find( key, &result)) {
        QPixmap source(desc.fileName);
        result = scale(size.width(), size.height(), source, desc);
        QPixmapCache::insert(key, result);
    }
    return result;
}